

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclaredType.cpp
# Opt level: O1

bool slang::ast::isValidForIfaceVar(Type *type)

{
  Type *pTVar1;
  SyntaxNode *pSVar2;
  bool bVar3;
  Type *pTVar4;
  long lVar5;
  bool bVar6;
  
  while( true ) {
    if (type->canonical == (Type *)0x0) {
      Type::resolveCanonical(type);
    }
    pTVar4 = type->canonical;
    if (pTVar4->canonical == (Type *)0x0) {
      Type::resolveCanonical(pTVar4);
    }
    if ((pTVar4->canonical->super_Symbol).kind == VirtualInterfaceType) break;
    bVar3 = Type::isUnpackedArray(pTVar4);
    if (!bVar3) {
      if (pTVar4->canonical == (Type *)0x0) {
        Type::resolveCanonical(pTVar4);
      }
      bVar3 = true;
      if (((pTVar4->canonical->super_Symbol).kind == UnpackedStructType) &&
         (pTVar1 = pTVar4[1].canonical, pTVar1 != (Type *)0x0)) {
        pSVar2 = pTVar4[1].super_Symbol.originatingSyntax;
        lVar5 = 0;
        do {
          pTVar4 = DeclaredType::getType
                             ((DeclaredType *)(*(long *)((long)&pSVar2->kind + lVar5) + 0x40));
          bVar3 = isValidForIfaceVar(pTVar4);
          if (!bVar3) {
            return bVar3;
          }
          bVar6 = (long)pTVar1 * 8 + -8 != lVar5;
          lVar5 = lVar5 + 8;
        } while (bVar6);
      }
      return bVar3;
    }
    type = Type::getArrayElementType(pTVar4);
  }
  return false;
}

Assistant:

static bool isValidForIfaceVar(const Type& type) {
    auto& ct = type.getCanonicalType();
    if (ct.isVirtualInterface())
        return false;

    if (ct.isUnpackedArray())
        return isValidForIfaceVar(*ct.getArrayElementType());

    if (ct.isUnpackedStruct()) {
        for (auto field : ct.as<UnpackedStructType>().fields) {
            if (!isValidForIfaceVar(field->getType()))
                return false;
        }
    }

    return true;
}